

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-projection.c
# Opt level: O2

_Bool borg_target_unknown_wall(wchar_t y,wchar_t x)

{
  uint8_t uVar1;
  ulong uVar2;
  wchar_t wVar3;
  _Bool _Var4;
  char *pcVar5;
  long lVar6;
  borg_grid *pbVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  wchar_t wVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  wchar_t n_y;
  wchar_t n_x;
  
  uVar2 = (ulong)(uint)y;
  pcVar5 = format("# Perhaps wall near targetted location (%d,%d)",uVar2,(ulong)(uint)x);
  borg_note(pcVar5);
  uVar12 = (ulong)(uint)borg.c.y;
  n_x = borg.c.x;
  lVar6 = (long)borg.c.y;
  n_y = borg.c.y;
  lVar8 = (long)borg.c.x;
  lVar9 = lVar8 * 0xc;
  uVar1 = borg_grids[lVar6 + 1][lVar8].feat;
  bVar14 = true;
  bVar13 = true;
  if ((((uVar1 == '\x01') && (*(char *)(*(long *)(&DAT_002f9138 + lVar6 * 8) + lVar9) == '\x01')) &&
      ((borg_grids[lVar6 + 2][lVar8].feat == '\x01' ||
       (*(char *)(*(long *)(borg_view_x + lVar6 * 8 + 0x2320) + lVar9) == '\x01')))) &&
     (borg_grids[lVar6][lVar8 + 1].feat != '\x01')) {
    bVar13 = borg_grids[lVar6][lVar8 + -1].feat == '\x01';
  }
  pbVar7 = borg_grids[lVar6];
  if ((pbVar7[lVar8 + 1].feat == '\x01') && (pbVar7[lVar8 + -1].feat == '\x01')) {
    if (pbVar7[lVar8 + 2].feat == '\x01') {
      if (uVar1 == '\x01') goto LAB_0022ad9a;
    }
    else if ((uVar1 == '\x01') || (pbVar7[lVar8 + -2].feat != '\x01')) goto LAB_0022ad9a;
    bVar14 = *(char *)(*(long *)(&DAT_002f9138 + lVar6 * 8) + lVar9) == '\x01';
  }
LAB_0022ad9a:
  do {
    wVar3 = n_x;
    wVar11 = (wchar_t)uVar12;
    lVar6 = (long)n_x;
    _Var4 = flag_has_dbg(r_info[borg_kills[pbVar7[lVar6].kill].r_idx].flags,0xb,0x2e,"r_ptr->flags",
                         "RF_PASS_WALL");
    if (_Var4) {
      pcVar5 = "# Guessing wall (%d,%d) under ghostly target (%d,%d)";
      uVar10 = (ulong)(uint)wVar3;
      uVar2 = uVar12;
LAB_0022ae99:
      pcVar5 = format(pcVar5,uVar12 & 0xffffffff,(ulong)(uint)wVar3,uVar2 & 0xffffffff,uVar10);
      borg_note(pcVar5);
      pbVar7 = borg_grids[wVar11] + lVar6;
LAB_0022af04:
      pbVar7->feat = '\x15';
      return true;
    }
    if (((borg_grids[wVar11][lVar6].feat == '\0') && (!(bool)(~bVar14 & wVar11 == borg.c.y))) &&
       (!(bool)(~bVar13 & wVar3 == borg.c.x))) {
      pcVar5 = "# Guessing wall (%d,%d) near target (%d,%d)";
      uVar10 = (ulong)(uint)x;
      goto LAB_0022ae99;
    }
    if ((wVar11 == y) && (wVar3 == x)) {
      borg_inc_motion(&n_y,&n_x,y,x,borg.c.y,borg.c.x);
      lVar6 = (long)n_y;
      lVar8 = (long)n_x;
      pcVar5 = format("# Guessing wall (%d,%d) near target (%d,%d)",(ulong)(uint)n_y,
                      (ulong)(uint)n_x,uVar2,(ulong)(uint)x);
      borg_note(pcVar5);
      pbVar7 = borg_grids[lVar6] + lVar8;
      goto LAB_0022af04;
    }
    borg_inc_motion(&n_y,&n_x,borg.c.y,borg.c.x,y,x);
    uVar12 = (ulong)n_y;
    pbVar7 = borg_grids[uVar12];
  } while( true );
}

Assistant:

bool borg_target_unknown_wall(int y, int x)
{
    int  n_x, n_y;
    bool found  = false;
    bool y_hall = false;
    bool x_hall = false;

    borg_grid           *ag;
    struct monster_race *r_ptr;
    borg_kill           *kill;

    borg_note(format("# Perhaps wall near targetted location (%d,%d)", y, x));

    /* Determine "path" */
    n_x = borg.c.x;
    n_y = borg.c.y;

    /* check for 'in a hall' x axis */
    /* This check is for this: */
    /*
     *      x        x
     *    ..@.  or  .@..
     *      x        x
     *
     * 'x' being 'not a floor' and '.' being a floor.
     *
     * We would like to know if in a hall so we can place
     * the suspect wall off the hallway path.
     * like this:######x  P
     * ........@....
     * ##################
     * The shot may miss and we want the borg to guess the
     * wall to be at the X instead of first unkown grid which
     * is 3 west and 1 south of the X.
     */

    if ((borg_grids[borg.c.y + 1][borg.c.x].feat == FEAT_FLOOR
            && borg_grids[borg.c.y - 1][borg.c.x].feat == FEAT_FLOOR
            && (borg_grids[borg.c.y + 2][borg.c.x].feat == FEAT_FLOOR
                || borg_grids[borg.c.y - 2][borg.c.x].feat == FEAT_FLOOR))
        && (borg_grids[borg.c.y][borg.c.x + 1].feat != FEAT_FLOOR
            && borg_grids[borg.c.y][borg.c.x - 1].feat != FEAT_FLOOR))
        x_hall = true;

    /* check for 'in a hall' y axis.
     * Again, we want to place the suspected wall off our
     * hallway.
     */
    if ((borg_grids[borg.c.y][borg.c.x + 1].feat == FEAT_FLOOR
            && borg_grids[borg.c.y][borg.c.x - 1].feat == FEAT_FLOOR
            && (borg_grids[borg.c.y][borg.c.x + 2].feat == FEAT_FLOOR
                || borg_grids[borg.c.y][borg.c.x - 2].feat == FEAT_FLOOR))
        && (borg_grids[borg.c.y + 1][borg.c.x].feat != FEAT_FLOOR
            && borg_grids[borg.c.y - 1][borg.c.x].feat != FEAT_FLOOR))
        y_hall = true;

    while (1) {
        ag    = &borg_grids[n_y][n_x];
        kill  = &borg_kills[ag->kill];
        r_ptr = &r_info[kill->r_idx];

        if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
            borg_note(
                format("# Guessing wall (%d,%d) under ghostly target (%d,%d)",
                    n_y, n_x, n_y, n_x));
            borg_grids[n_y][n_x].feat = FEAT_GRANITE;
            found                     = true;
            return (found); /* not sure... should we return here? */
        }

        if (borg_grids[n_y][n_x].feat == FEAT_NONE
            && ((n_y != borg.c.y) || !y_hall)
            && ((n_x != borg.c.x) || !x_hall)) {
            borg_note(format(
                "# Guessing wall (%d,%d) near target (%d,%d)", n_y, n_x, y, x));
            borg_grids[n_y][n_x].feat = FEAT_GRANITE;
            found                     = true;
            return (found); /* not sure... should we return here?
                             maybe should mark ALL unknowns in path... */
        }

        /* Pathway found the target. */
        if (n_x == x && n_y == y) {
            /* end of the pathway */
            borg_inc_motion(&n_y, &n_x, y, x, borg.c.y, borg.c.x);
            borg_note(format(
                "# Guessing wall (%d,%d) near target (%d,%d)", n_y, n_x, y, x));
            borg_grids[n_y][n_x].feat = FEAT_GRANITE;
            found                     = true;
            return (found);
        }

        /* Calculate the new location */
        borg_inc_motion(&n_y, &n_x, borg.c.y, borg.c.x, y, x);
    }
}